

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnStructType
          (BinaryReaderObjdump *this,Index index,Index field_count,TypeMut *fields)

{
  char *pcVar1;
  undefined4 in_register_00000034;
  ulong uVar2;
  
  if ((((this->super_BinaryReaderObjdumpBase).options_)->mode == Details) &&
     (((this->super_BinaryReaderObjdumpBase).print_details_ & 1U) != 0)) {
    printf(" - type[%u] (struct",CONCAT44(in_register_00000034,index));
    if (field_count != 0) {
      uVar2 = (ulong)field_count;
      do {
        if (fields->mutable_ == true) {
          printf(" (mut");
        }
        pcVar1 = Type::GetName(&fields->type);
        printf(" %s",pcVar1);
        if (fields->mutable_ == true) {
          putchar(0x29);
        }
        fields = fields + 1;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
    puts(")");
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnStructType(Index index,
                                         Index field_count,
                                         TypeMut* fields) {
  if (!ShouldPrintDetails()) {
    return Result::Ok;
  }
  printf(" - type[%" PRIindex "] (struct", index);
  for (Index i = 0; i < field_count; i++) {
    if (fields[i].mutable_) {
      printf(" (mut");
    }
    printf(" %s", fields[i].type.GetName());
    if (fields[i].mutable_) {
      printf(")");
    }
  }
  printf(")\n");
  return Result::Ok;
}